

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

string * __thiscall
backward::details::demangler_impl<backward::system_tag::linux_tag>::demangle_abi_cxx11_
          (string *__return_storage_ptr__,demangler_impl<backward::system_tag::linux_tag> *this,
          char *funcname)

{
  char *pcVar1;
  allocator *paVar2;
  allocator local_1a;
  allocator local_19;
  
  pcVar1 = (char *)__cxa_demangle(funcname,(this->_demangle_buffer)._val,
                                  &this->_demangle_buffer_length,0);
  if (pcVar1 == (char *)0x0) {
    paVar2 = &local_1a;
  }
  else {
    (this->_demangle_buffer)._val = pcVar1;
    (this->_demangle_buffer)._empty = false;
    paVar2 = &local_19;
    funcname = pcVar1;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,funcname,paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string demangle(const char *funcname) {
    using namespace details;
    char *result = abi::__cxa_demangle(funcname, _demangle_buffer.get(),
                                       &_demangle_buffer_length, nullptr);
    if (result) {
      _demangle_buffer.update(result);
      return result;
    }
    return funcname;
  }